

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 target,U32 mls,int extDict)

{
  BYTE *pBVar1;
  ulong *puVar2;
  uint uVar3;
  BYTE *pBVar4;
  U32 *pUVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  uint *puVar12;
  char cVar13;
  ulong uVar14;
  uint *puVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  U32 lowestValid;
  ulong uVar21;
  long lVar22;
  ulong *puVar23;
  BYTE *pBVar24;
  uint uVar25;
  ulong uVar26;
  U32 dummy32;
  BYTE *pInLoopLimit;
  uint *local_c8;
  uint local_9c;
  BYTE *local_98;
  BYTE *local_90;
  ulong local_88;
  BYTE *local_80;
  ulong *local_78;
  ulong local_70;
  ulong *local_68;
  BYTE *local_60;
  ulong *local_58;
  ulong *local_50;
  BYTE *local_48;
  BYTE *local_40;
  ulong local_38;
  
  uVar20 = (ms->cParams).hashLog;
  if (0x20 < uVar20) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  cVar13 = (char)uVar20;
  switch(mls) {
  case 5:
    lVar22 = -0x30e4432345000000;
    break;
  case 6:
    lVar22 = -0x30e4432340650000;
    break;
  case 7:
    lVar22 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar22 = -0x30e44323485a9b9d;
    break;
  default:
    uVar21 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar13 & 0x1fU));
    goto LAB_001c9156;
  }
  uVar21 = (ulong)(lVar22 * *(long *)ip) >> (-cVar13 & 0x3fU);
LAB_001c9156:
  uVar17 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  pBVar4 = (ms->window).base;
  uVar25 = (int)ip - (int)pBVar4;
  uVar20 = uVar25 - uVar17;
  if (uVar25 < uVar17) {
    uVar20 = 0;
  }
  uVar3 = (ms->window).lowLimit;
  uVar18 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar16 = target - uVar18;
  if (target - uVar3 <= uVar18) {
    uVar16 = uVar3;
  }
  if (ms->loadedDictEnd != 0) {
    uVar16 = uVar3;
  }
  iVar19 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (target < uVar25) {
    __assert_fail("curr <= target",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8100,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8101,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  pUVar5 = ms->chainTable;
  uVar3 = ms->hashTable[uVar21];
  local_90 = (ms->window).dictBase;
  uVar14 = (ulong)(ms->window).dictLimit;
  ms->hashTable[uVar21] = uVar25;
  if (uVar16 == 0) {
    __assert_fail("windowLow > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8104,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  uVar21 = (ulong)((uVar25 & uVar17) * 2);
  local_c8 = pUVar5 + uVar21;
  puVar15 = pUVar5 + uVar21 + 1;
  uVar18 = uVar25 + 9;
  uVar21 = 8;
  if (uVar3 < uVar16) {
LAB_001c9523:
    *puVar15 = 0;
    *local_c8 = 0;
    uVar20 = uVar18 - (uVar25 + 8);
    if (uVar18 < uVar25 + 8 || uVar20 == 0) {
      __assert_fail("matchEndIdx > curr + 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8147,
                    "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                   );
    }
    uVar25 = (int)uVar21 - 0x180;
    uVar17 = 0xc0;
    if (uVar25 < 0xc0) {
      uVar17 = uVar25;
    }
    uVar25 = 0;
    if (0x180 < uVar21) {
      uVar25 = uVar17;
    }
    if (uVar25 <= uVar20) {
      uVar25 = uVar20;
    }
    return uVar25;
  }
  local_40 = local_90 + uVar14;
  local_48 = pBVar4 + uVar14;
  local_68 = (ulong *)(iend + -7);
  local_50 = (ulong *)(iend + -3);
  local_58 = (ulong *)(iend + -1);
  local_98 = pBVar4 + 8;
  local_60 = ip + 8;
  uVar10 = 0;
  local_70 = 0;
  local_88 = (ulong)uVar25;
  local_80 = ip;
  local_78 = (ulong *)iend;
  do {
    uVar26 = (ulong)uVar3;
    uVar8 = local_70;
    if (uVar10 < local_70) {
      uVar8 = uVar10;
    }
    local_38 = uVar10;
    if ((uint)local_88 <= uVar3) {
      __assert_fail("matchIndex < curr",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8108,
                    "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                   );
    }
    uVar10 = uVar8 + uVar26;
    if ((extDict == 0) || (uVar14 <= uVar10)) {
      if (uVar10 < uVar14) {
        __assert_fail("matchIndex+matchLength >= dictLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8120,
                      "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                     );
      }
      puVar2 = (ulong *)(local_80 + uVar8);
      puVar23 = (ulong *)(pBVar4 + uVar26 + uVar8);
      puVar11 = puVar2;
      if (puVar2 < local_68) {
        if (*puVar23 == *puVar2) {
          lVar22 = 0;
          do {
            puVar11 = (ulong *)(local_60 + lVar22 + uVar8);
            if (local_68 <= puVar11) {
              puVar23 = (ulong *)(local_98 + uVar10 + lVar22);
              goto LAB_001c93db;
            }
            lVar6 = lVar22 + uVar10;
            lVar22 = lVar22 + 8;
          } while (*(ulong *)(local_98 + lVar6) == *puVar11);
          uVar9 = *puVar11 ^ *(ulong *)(local_98 + lVar6);
          uVar10 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar10 = (uVar10 >> 3 & 0x1fffffff) + lVar22;
        }
        else {
          uVar9 = *puVar2 ^ *puVar23;
          uVar10 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar10 = uVar10 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_001c93db:
        if ((puVar11 < local_50) && ((int)*puVar23 == (int)*puVar11)) {
          puVar11 = (ulong *)((long)puVar11 + 4);
          puVar23 = (ulong *)((long)puVar23 + 4);
        }
        if ((puVar11 < local_58) && ((short)*puVar23 == (short)*puVar11)) {
          puVar11 = (ulong *)((long)puVar11 + 2);
          puVar23 = (ulong *)((long)puVar23 + 2);
        }
        if (puVar11 < local_78) {
          puVar11 = (ulong *)((long)puVar11 + (ulong)((byte)*puVar23 == (byte)*puVar11));
        }
        uVar10 = (long)puVar11 - (long)puVar2;
      }
      uVar8 = uVar10 + uVar8;
      pBVar24 = pBVar4 + uVar26;
    }
    else {
      pBVar1 = local_90 + uVar26;
      sVar7 = ZSTD_count_2segments
                        (local_80 + uVar8,pBVar1 + uVar8,(BYTE *)local_78,local_40,local_48);
      uVar8 = sVar7 + uVar8;
      pBVar24 = pBVar4 + uVar26;
      if (uVar8 + uVar26 < uVar14) {
        pBVar24 = pBVar1;
      }
    }
    if ((uVar21 < uVar8) && (uVar21 = uVar8, uVar18 - uVar3 < uVar8)) {
      uVar18 = uVar3 + (int)uVar8;
    }
    uVar25 = (uint)local_88;
    if ((ulong *)(local_80 + uVar8) == local_78) goto LAB_001c9523;
    puVar12 = pUVar5 + (uVar3 & uVar17) * 2;
    if (pBVar24[uVar8] < (byte)*(ulong *)(local_80 + uVar8)) {
      *local_c8 = uVar3;
      if (uVar3 <= uVar20) {
        local_c8 = &local_9c;
        goto LAB_001c9523;
      }
      puVar12 = puVar12 + 1;
      uVar10 = uVar8;
      local_c8 = puVar12;
    }
    else {
      *puVar15 = uVar3;
      puVar15 = puVar12;
      uVar10 = local_38;
      local_70 = uVar8;
      if (uVar3 <= uVar20) {
        puVar15 = &local_9c;
        goto LAB_001c9523;
      }
    }
    iVar19 = iVar19 + -1;
    if ((iVar19 == 0) || (uVar3 = *puVar12, uVar3 < uVar16)) goto LAB_001c9523;
  } while( true );
}

Assistant:

static U32 ZSTD_insertBt1(
                const ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const target,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 curr = (U32)(ip-base);
    const U32 btLow = btMask >= curr ? 0 : curr - btMask;
    U32* smallerPtr = bt + 2*(curr&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    /* windowLow is based on target because
     * we only need positions that will be in the window at the end of the tree update.
     */
    U32 const windowLow = ZSTD_getLowestMatchIndex(ms, target, cParams->windowLog);
    U32 matchEndIdx = curr+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((curr-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((curr-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", curr);

    assert(curr <= target);
    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = curr;   /* Update Hash Table */

    assert(windowLow > 0);
    for (; nbCompares && (matchIndex >= windowLow); --nbCompares) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < curr);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    {   U32 positions = 0;
        if (bestLength > 384) positions = MIN(192, (U32)(bestLength - 384));   /* speed optimization */
        assert(matchEndIdx > curr + 8);
        return MAX(positions, matchEndIdx - (curr + 8));
    }
}